

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddPerm(Abc_ZddMan *p,int a,int Var)

{
  Abc_ZddObj *pAVar1;
  int iVar2;
  int j;
  Abc_ZddEnt *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int j_00;
  uint uVar8;
  
  if (p->nVars <= Var) {
    __assert_fail("Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                  ,0x223,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
  }
  if (a == 0) {
    return 0;
  }
  if (a == 1) {
    return Var + 2;
  }
  pAVar3 = p->pCache;
  uVar8 = a * 0xc00005 + Var * 0x40f1f9 + 0x389195;
  uVar7 = p->nCacheMask & uVar8;
  p->nCacheLookups = p->nCacheLookups + 1;
  iVar4 = -1;
  if (((pAVar3[uVar7].Arg0 == a) && (pAVar3[uVar7].Arg1 == Var)) && (pAVar3[uVar7].Arg2 == 5)) {
    iVar4 = pAVar3[uVar7].Res;
  }
  if (-1 < iVar4) {
    return iVar4;
  }
  uVar7 = *(uint *)(p->pObjs + a) & 0x7fffffff;
  iVar4 = p->pV2TI[uVar7];
  iVar5 = p->pV2TI[Var];
  if (iVar5 < iVar4) {
    iVar5 = 0;
    uVar7 = Var;
    iVar4 = a;
LAB_0040441d:
    iVar4 = Abc_ZddUniqueCreate(p,uVar7,iVar4,iVar5);
  }
  else {
    pAVar1 = p->pObjs + a;
    if (uVar7 == Var) {
      iVar5 = Abc_ZddPerm(p,pAVar1->False,Var);
      uVar7 = pAVar1->True;
    }
    else {
      iVar2 = p->pV2TJ[uVar7];
      if ((iVar2 <= iVar4) || (j = p->pV2TJ[Var], j <= iVar5)) {
        __assert_fail("Ai < Aj && Bi < Bj && Ai <= Bi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x235,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      j_00 = j;
      iVar6 = Var;
      if ((iVar2 == iVar5) || (j_00 = iVar5, iVar2 == j)) {
        uVar7 = Abc_ZddVarIJ(p,iVar4,j_00);
      }
      else if (iVar4 == iVar5) {
        iVar4 = j;
        if (iVar2 < j) {
          iVar4 = iVar2;
        }
        if (j < iVar2) {
          j = iVar2;
        }
        iVar6 = Abc_ZddVarIJ(p,iVar4,j);
        uVar7 = *(uint *)pAVar1 & 0x7fffffff;
      }
      if (p->pV2TI[iVar6] <= p->pV2TI[(int)uVar7]) {
        __assert_fail("p->pV2TI[VarPerm] > p->pV2TI[VarTop]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x242,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      iVar5 = Abc_ZddPerm(p,pAVar1->False,Var);
      iVar4 = Abc_ZddPerm(p,pAVar1->True,iVar6);
      if ((int)(*(uint *)(p->pObjs + iVar4) & 0x7fffffff) <= (int)uVar7) {
        __assert_fail("Abc_ZddObjVar(p, r1) > VarTop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x245,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
      }
      if ((int)uVar7 < (int)(*(uint *)(p->pObjs + iVar5) & 0x7fffffff)) goto LAB_0040441d;
      uVar7 = Abc_ZddUniqueCreate(p,uVar7,iVar4,0);
    }
    iVar4 = Abc_ZddUnion(p,iVar5,uVar7);
  }
  pAVar3 = p->pCache;
  uVar8 = uVar8 & p->nCacheMask;
  pAVar3[uVar8].Arg0 = a;
  pAVar3[uVar8].Arg1 = Var;
  pAVar3[uVar8].Arg2 = 5;
  pAVar3[uVar8].Res = iVar4;
  p->nCacheMisses = p->nCacheMisses + 1;
  if (-1 < iVar4) {
    return iVar4;
  }
  __assert_fail("Res >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
}

Assistant:

int Abc_ZddPerm( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    assert( Var < p->nVars );
    if ( a == 0 )  return 0;
    if ( a == 1 )  return Abc_ZddIthVar(Var);
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_PERM)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    if ( p->pV2TI[A->Var] > p->pV2TI[Var] ) // Ai > Bi
        r = Abc_ZddUniqueCreate( p, Var, a, 0 );
    else if ( (int)A->Var == Var ) // Ai == Bi && Aj == Bj
        r0 = Abc_ZddPerm( p, A->False, Var ), 
        r  = Abc_ZddUnion( p, r0, A->True );
    else 
    {
        int VarPerm, VarTop;
        int Ai = p->pV2TI[A->Var];
        int Aj = p->pV2TJ[A->Var];
        int Bi = p->pV2TI[Var];
        int Bj = p->pV2TJ[Var];
        assert( Ai < Aj && Bi < Bj && Ai <= Bi );
        if ( Aj == Bi )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bj);
        else if ( Aj == Bj )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bi);
        else if ( Ai == Bi )
            VarPerm = Abc_ZddVarIJ(p, Abc_MinInt(Aj, Bj), Abc_MaxInt(Aj, Bj)),
            VarTop  = A->Var;
        else // no clash
            VarPerm = Var, 
            VarTop  = A->Var;
        assert( p->pV2TI[VarPerm] > p->pV2TI[VarTop] );
        r0 = Abc_ZddPerm( p, A->False, Var ); 
        r1 = Abc_ZddPerm( p, A->True, VarPerm );
        assert( Abc_ZddObjVar(p, r1) > VarTop );
        if ( Abc_ZddObjVar(p, r0) > VarTop )
            r = Abc_ZddUniqueCreate( p, VarTop, r1, r0 );
        else
            r1 = Abc_ZddUniqueCreate( p, VarTop, r1, 0 ),
            r = Abc_ZddUnion( p, r0, r1 );
    }
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_PERM, r );
}